

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var * __thiscall cs::runtime_type::parse_access_lhs(runtime_type *this,var *a,var *b)

{
  longdouble lVar1;
  bool bVar2;
  type_info *ptVar3;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  numeric *pnVar4;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_01;
  size_t sVar5;
  MappedReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> paVar6;
  size_type sVar7;
  runtime_error *prVar8;
  reference paVar9;
  ulong __n;
  ulong uVar11;
  anon_union_16_2_310e9938_for_data local_b8;
  undefined1 local_a8;
  any local_98;
  longdouble local_8c;
  any local_80;
  ulong local_78;
  undefined2 uStack_70;
  ulong local_68;
  long local_60;
  size_type local_58;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_50;
  longdouble local_38;
  numeric_integer nVar10;
  
  ptVar3 = cs_impl::any::type(a);
  bVar2 = std::type_info::operator==
                    (ptVar3,(type_info *)
                            &std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  if (!bVar2) {
    ptVar3 = cs_impl::any::type(a);
    bVar2 = std::type_info::operator==
                      (ptVar3,(type_info *)
                              &phmap::
                               flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                               ::typeinfo);
    if (bVar2) {
      this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 *)cs_impl::any::
                   val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                             (a);
      sVar5 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              ::count<cs_impl::any>(this_01,b);
      if (sVar5 == 0) {
        local_80.mDat = b->mDat;
        if (local_80.mDat != (proxy *)0x0) {
          (local_80.mDat)->refcount = (local_80.mDat)->refcount + 1;
        }
        copy((EVP_PKEY_CTX *)&local_98,(EVP_PKEY_CTX *)&local_80);
        local_a8 = 1;
        local_b8._int = 0;
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
        ::emplace<cs_impl::any,_cs::numeric,_0>(&local_50,this_01,&local_98,(numeric *)&local_b8);
        cs_impl::any::recycle(&local_98);
        cs_impl::any::recycle(&local_80);
      }
      paVar6 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
               ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                           *)this_01,b);
      return paVar6;
    }
    ptVar3 = cs_impl::any::type(a);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&local_b8,"Access string object as lvalue.",(allocator *)&local_50);
      runtime_error::runtime_error(prVar8,(string *)&local_b8);
      __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    std::__cxx11::string::string
              ((string *)&local_b8,"Access non-array or string object.",(allocator *)&local_50);
    runtime_error::runtime_error(prVar8,(string *)&local_b8);
    __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  ptVar3 = cs_impl::any::type(b);
  bVar2 = std::type_info::operator!=(ptVar3,(type_info *)&numeric::typeinfo);
  if (bVar2) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_b8,"Index must be a numeric.",(allocator *)&local_50);
    runtime_error::runtime_error(prVar8,(string *)&local_b8);
    __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  this_00 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(a);
  pnVar4 = cs_impl::any::const_val<cs::numeric>(b);
  if (pnVar4->type == true) {
    if ((pnVar4->data)._int < 0) {
LAB_00156ceb:
      pnVar4 = cs_impl::any::const_val<cs::numeric>(b);
      bVar2 = pnVar4->type;
      if (bVar2 == true) {
        local_78 = -(pnVar4->data)._int;
        uStack_70 = 0;
        local_8c = (longdouble)(unkuint10)local_78;
      }
      else {
        local_8c = -*(longdouble *)&pnVar4->data;
      }
      sVar7 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
      if (bVar2 == false) {
        local_58 = sVar7;
        if ((longdouble)(long)sVar7 +
            (longdouble)*(float *)(&DAT_001ccb50 + (ulong)((long)sVar7 < 0) * 4) < local_8c)
        goto LAB_00156def;
      }
      else {
        local_38 = local_8c;
        lVar1 = local_38;
        local_38._0_8_ = SUB108(local_8c,0);
        bVar2 = sVar7 < local_38._0_8_;
        local_38 = lVar1;
        if (bVar2) {
LAB_00156def:
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_b8,"Out of range.",(allocator *)&local_50);
          runtime_error::runtime_error(prVar8,(string *)&local_b8);
          __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
      }
      sVar7 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
      pnVar4 = cs_impl::any::const_val<cs::numeric>(b);
      local_60 = (long)ROUND(*(longdouble *)&pnVar4->data);
      nVar10 = local_60;
      if (pnVar4->type != false) {
        nVar10 = (pnVar4->data)._int;
      }
      __n = nVar10 + sVar7;
      goto LAB_00156e40;
    }
  }
  else if (*(longdouble *)&pnVar4->data < (longdouble)0) goto LAB_00156ceb;
  pnVar4 = cs_impl::any::const_val<cs::numeric>(b);
  local_68 = (ulong)ROUND(*(longdouble *)&pnVar4->data);
  __n = local_68;
  if (pnVar4->type != false) {
    __n = (pnVar4->data)._int;
  }
  sVar7 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
  if (sVar7 <= __n) {
    sVar7 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
    for (uVar11 = sVar7 - 1; __n != uVar11; uVar11 = uVar11 + 1) {
      local_a8 = 1;
      local_b8._int = 0;
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                (this_00,(numeric *)&local_b8);
    }
  }
LAB_00156e40:
  paVar9 = std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator[]
                     (&(this_00->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start,__n);
  return paVar9;
}

Assistant:

var &runtime_type::parse_access_lhs(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			auto &arr = a.val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= arr.size()) {
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > arr.size())
					throw runtime_error("Out of range.");
				posit = arr.size() + b.const_val<numeric>().as_integer();
			}
			return arr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			auto &map = a.val<hash_map>();
			if (map.count(b) == 0)
				map.emplace(copy(b), numeric(0));
			return map.at(b);
		}
		else if (a.type() == typeid(string))
			throw runtime_error("Access string object as lvalue.");
		else
			throw runtime_error("Access non-array or string object.");
	}